

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O1

void __thiscall
asio::detail::scoped_ptr<asio::io_context>::~scoped_ptr(scoped_ptr<asio::io_context> *this)

{
  io_context *piVar1;
  service_registry *psVar2;
  _func_int ***ppp_Var3;
  service *psVar4;
  
  piVar1 = this->p_;
  if (piVar1 == (io_context *)0x0) {
    return;
  }
  for (psVar4 = ((piVar1->super_execution_context).service_registry_)->first_service_;
      psVar4 != (service *)0x0; psVar4 = psVar4->next_) {
    (*psVar4->_vptr_service[2])(psVar4);
  }
  psVar2 = (piVar1->super_execution_context).service_registry_;
  psVar4 = psVar2->first_service_;
  while (psVar4 != (service *)0x0) {
    ppp_Var3 = &psVar4->_vptr_service;
    psVar4 = psVar4->next_;
    (*(*ppp_Var3)[1])();
    psVar2->first_service_ = psVar4;
  }
  psVar2 = (piVar1->super_execution_context).service_registry_;
  if (psVar2 != (service_registry *)0x0) {
    pthread_mutex_destroy((pthread_mutex_t *)&psVar2->mutex_);
    operator_delete(psVar2);
  }
  operator_delete(piVar1);
  return;
}

Assistant:

~scoped_ptr()
  {
    delete p_;
  }